

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aec_core_sse2.cc
# Opt level: O1

void webrtc::OverdriveAndSuppressSSE2(AecCore *aec,float *hNl,float hNlFb,float (*efw) [65])

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  long lVar8;
  ulong uVar9;
  float fVar10;
  uint uVar11;
  float fVar12;
  uint uVar14;
  float fVar15;
  uint uVar16;
  float fVar17;
  uint uVar18;
  undefined1 auVar13 [16];
  float fVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  
  auVar7 = _DAT_001a85f0;
  auVar6 = _DAT_001a85e0;
  fVar10 = aec->overDriveSm;
  lVar8 = 0;
  do {
    pfVar1 = hNl + lVar8;
    fVar12 = *pfVar1;
    fVar15 = pfVar1[1];
    fVar17 = pfVar1[2];
    fVar19 = pfVar1[3];
    uVar11 = ~-(uint)(hNlFb < fVar12) & (uint)fVar12 |
             (uint)((1.0 - (float)(&WebRtcAec_weightCurve)[lVar8]) * fVar12 +
                   hNlFb * (float)(&WebRtcAec_weightCurve)[lVar8]) & -(uint)(hNlFb < fVar12);
    uVar14 = ~-(uint)(hNlFb < fVar15) & (uint)fVar15 |
             (uint)((1.0 - (float)(&DAT_001a7e44)[lVar8]) * fVar15 +
                   hNlFb * (float)(&DAT_001a7e44)[lVar8]) & -(uint)(hNlFb < fVar15);
    uVar16 = ~-(uint)(hNlFb < fVar17) & (uint)fVar17 |
             (uint)((1.0 - *(float *)(&UNK_001a7e48 + lVar8 * 4)) * fVar17 +
                   hNlFb * *(float *)(&UNK_001a7e48 + lVar8 * 4)) & -(uint)(hNlFb < fVar17);
    uVar18 = ~-(uint)(hNlFb < fVar19) & (uint)fVar19 |
             (uint)((1.0 - *(float *)(&UNK_001a7e4c + lVar8 * 4)) * fVar19 +
                   hNlFb * *(float *)(&UNK_001a7e4c + lVar8 * 4)) & -(uint)(hNlFb < fVar19);
    fVar12 = (float)(uVar11 & 0x7fffff | 0x3f800000);
    fVar15 = (float)(uVar14 & 0x7fffff | 0x3f800000);
    fVar17 = (float)(uVar16 & 0x7fffff | 0x3f800000);
    fVar19 = (float)(uVar18 & 0x7fffff | 0x3f800000);
    auVar13._0_4_ =
         ((fVar12 + -1.0) *
          (((((fVar12 * -0.034436006 + 0.31821337) * fVar12 + -1.2315303) * fVar12 + 2.5988452) *
            fVar12 + -3.324199) * fVar12 + 3.11579) +
         (float)(uVar11 >> 8 & 0x7f8000 | 0x43800000) + -383.0) *
         (float)(&WebRtcAec_overDriveCurve)[lVar8] * fVar10;
    auVar13._4_4_ =
         ((fVar15 + -1.0) *
          (((((fVar15 * -0.034436006 + 0.31821337) * fVar15 + -1.2315303) * fVar15 + 2.5988452) *
            fVar15 + -3.324199) * fVar15 + 3.11579) +
         (float)(uVar14 >> 8 & 0x7f8000 | 0x43800000) + -383.0) *
         (float)(&DAT_001a7f54)[lVar8] * fVar10;
    auVar13._8_4_ =
         ((fVar17 + -1.0) *
          (((((fVar17 * -0.034436006 + 0.31821337) * fVar17 + -1.2315303) * fVar17 + 2.5988452) *
            fVar17 + -3.324199) * fVar17 + 3.11579) +
         (float)(uVar16 >> 8 & 0x7f8000 | 0x43800000) + -383.0) *
         *(float *)(&UNK_001a7f58 + lVar8 * 4) * fVar10;
    auVar13._12_4_ =
         ((fVar19 + -1.0) *
          (((((fVar19 * -0.034436006 + 0.31821337) * fVar19 + -1.2315303) * fVar19 + 2.5988452) *
            fVar19 + -3.324199) * fVar19 + 3.11579) +
         (float)(uVar18 >> 8 & 0x7f8000 | 0x43800000) + -383.0) *
         *(float *)(&UNK_001a7f5c + lVar8 * 4) * fVar10;
    auVar13 = minps(auVar13,auVar6);
    auVar13 = maxps(auVar13,auVar7);
    iVar20 = (int)(auVar13._0_4_ + -0.5);
    iVar21 = (int)(auVar13._4_4_ + -0.5);
    iVar22 = (int)(auVar13._8_4_ + -0.5);
    iVar23 = (int)(auVar13._12_4_ + -0.5);
    fVar12 = auVar13._0_4_ - (float)iVar20;
    fVar15 = auVar13._4_4_ - (float)iVar21;
    fVar17 = auVar13._8_4_ - (float)iVar22;
    fVar19 = auVar13._12_4_ - (float)iVar23;
    fVar24 = ((fVar12 * 0.33718944 + 0.6576363) * fVar12 + 1.0017247) *
             (float)(iVar20 * 0x800000 + 0x3f800000);
    fVar25 = ((fVar15 * 0.33718944 + 0.6576363) * fVar15 + 1.0017247) *
             (float)(iVar21 * 0x800000 + 0x3f800000);
    fVar26 = ((fVar17 * 0.33718944 + 0.6576363) * fVar17 + 1.0017247) *
             (float)(iVar22 * 0x800000 + 0x3f800000);
    fVar27 = ((fVar19 * 0.33718944 + 0.6576363) * fVar19 + 1.0017247) *
             (float)(iVar23 * 0x800000 + 0x3f800000);
    pfVar1 = hNl + lVar8;
    *pfVar1 = fVar24;
    pfVar1[1] = fVar25;
    pfVar1[2] = fVar26;
    pfVar1[3] = fVar27;
    pfVar1 = *efw + lVar8;
    fVar12 = pfVar1[1];
    fVar15 = pfVar1[2];
    fVar17 = pfVar1[3];
    pfVar2 = efw[1] + lVar8;
    fVar19 = *pfVar2;
    fVar3 = pfVar2[1];
    fVar4 = pfVar2[2];
    fVar5 = pfVar2[3];
    pfVar2 = *efw + lVar8;
    *pfVar2 = *pfVar1 * fVar24;
    pfVar2[1] = fVar12 * fVar25;
    pfVar2[2] = fVar15 * fVar26;
    pfVar2[3] = fVar17 * fVar27;
    pfVar1 = efw[1] + lVar8;
    *pfVar1 = -fVar19 * fVar24;
    pfVar1[1] = -fVar3 * fVar25;
    pfVar1[2] = -fVar4 * fVar26;
    pfVar1[3] = -fVar5 * fVar27;
    uVar9 = lVar8 + 7;
    lVar8 = lVar8 + 4;
  } while (uVar9 < 0x41);
  if (hNlFb < hNl[0x40]) {
    hNl[0x40] = hNlFb * 0.4 + hNl[0x40] * 0.6;
  }
  fVar10 = powf(hNl[0x40],aec->overDriveSm * 2.0);
  hNl[0x40] = fVar10;
  (*efw)[0x40] = fVar10 * (*efw)[0x40];
  efw[1][0x40] = -efw[1][0x40] * hNl[0x40];
  return;
}

Assistant:

static void OverdriveAndSuppressSSE2(AecCore* aec,
                                     float hNl[PART_LEN1],
                                     const float hNlFb,
                                     float efw[2][PART_LEN1]) {
  int i;
  const __m128 vec_hNlFb = _mm_set1_ps(hNlFb);
  const __m128 vec_one = _mm_set1_ps(1.0f);
  const __m128 vec_minus_one = _mm_set1_ps(-1.0f);
  const __m128 vec_overDriveSm = _mm_set1_ps(aec->overDriveSm);
  // vectorized code (four at once)
  for (i = 0; i + 3 < PART_LEN1; i += 4) {
    // Weight subbands
    __m128 vec_hNl = _mm_loadu_ps(&hNl[i]);
    const __m128 vec_weightCurve = _mm_loadu_ps(&WebRtcAec_weightCurve[i]);
    const __m128 bigger = _mm_cmpgt_ps(vec_hNl, vec_hNlFb);
    const __m128 vec_weightCurve_hNlFb = _mm_mul_ps(vec_weightCurve, vec_hNlFb);
    const __m128 vec_one_weightCurve = _mm_sub_ps(vec_one, vec_weightCurve);
    const __m128 vec_one_weightCurve_hNl =
        _mm_mul_ps(vec_one_weightCurve, vec_hNl);
    const __m128 vec_if0 = _mm_andnot_ps(bigger, vec_hNl);
    const __m128 vec_if1 = _mm_and_ps(
        bigger, _mm_add_ps(vec_weightCurve_hNlFb, vec_one_weightCurve_hNl));
    vec_hNl = _mm_or_ps(vec_if0, vec_if1);

    {
      const __m128 vec_overDriveCurve =
          _mm_loadu_ps(&WebRtcAec_overDriveCurve[i]);
      const __m128 vec_overDriveSm_overDriveCurve =
          _mm_mul_ps(vec_overDriveSm, vec_overDriveCurve);
      vec_hNl = mm_pow_ps(vec_hNl, vec_overDriveSm_overDriveCurve);
      _mm_storeu_ps(&hNl[i], vec_hNl);
    }

    // Suppress error signal
    {
      __m128 vec_efw_re = _mm_loadu_ps(&efw[0][i]);
      __m128 vec_efw_im = _mm_loadu_ps(&efw[1][i]);
      vec_efw_re = _mm_mul_ps(vec_efw_re, vec_hNl);
      vec_efw_im = _mm_mul_ps(vec_efw_im, vec_hNl);

      // Ooura fft returns incorrect sign on imaginary component. It matters
      // here because we are making an additive change with comfort noise.
      vec_efw_im = _mm_mul_ps(vec_efw_im, vec_minus_one);
      _mm_storeu_ps(&efw[0][i], vec_efw_re);
      _mm_storeu_ps(&efw[1][i], vec_efw_im);
    }
  }
  // scalar code for the remaining items.
  for (; i < PART_LEN1; i++) {
    // Weight subbands
    if (hNl[i] > hNlFb) {
      hNl[i] = WebRtcAec_weightCurve[i] * hNlFb +
               (1 - WebRtcAec_weightCurve[i]) * hNl[i];
    }
    hNl[i] = powf(hNl[i], aec->overDriveSm * WebRtcAec_overDriveCurve[i]);

    // Suppress error signal
    efw[0][i] *= hNl[i];
    efw[1][i] *= hNl[i];

    // Ooura fft returns incorrect sign on imaginary component. It matters
    // here because we are making an additive change with comfort noise.
    efw[1][i] *= -1;
  }
}